

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Index.cpp
# Opt level: O2

void print_usage(string *exec_name)

{
  fmt::v6::
  print<char[53],_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_0>
            (_stderr,(char (*) [53])"Usage: {} [option] /path/to/database /path/to/index\n",
             exec_name);
  fmt::v6::print<char[61],_0>
            (_stderr,(char (*) [61])"    [-w <workers>]     number of workers to use, default: 4\n")
  ;
  fmt::v6::print<char[67],_0>
            (_stderr,(char (*) [67])
                     "    [-b <batch_size>]  number of samples per batch, default: 1000\n");
  fmt::v6::print<char[87],_0>
            (_stderr,(char (*) [87])
                     "    [-i <index_type>]  (multi) type of index, default: gram3, text4, wide8, and hash4\n"
            );
  fmt::v6::print<char[71],_0>
            (_stderr,(char (*) [71])
                     "    [-t <tag>]         (multi) tag to apply to samples, default: none\n");
  return;
}

Assistant:

void print_usage(const std::string &exec_name) {
    // clang-format off
    fmt::print(stderr, "Usage: {} [option] /path/to/database /path/to/index\n", exec_name);
    fmt::print(stderr, "    [-w <workers>]     number of workers to use, default: 4\n");
    fmt::print(stderr, "    [-b <batch_size>]  number of samples per batch, default: 1000\n");
    fmt::print(stderr, "    [-i <index_type>]  (multi) type of index, default: gram3, text4, wide8, and hash4\n");
    fmt::print(stderr, "    [-t <tag>]         (multi) tag to apply to samples, default: none\n");
    // clang-format on
}